

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::split_node
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint index)

{
  node_vec_type *this_00;
  uint *puVar1;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar7;
  void *p;
  float fVar8;
  float fVar9;
  float fVar10;
  uint i_2;
  uint uVar11;
  int iVar12;
  vq_node *pvVar13;
  uint i;
  int iVar14;
  uint uVar15;
  long lVar16;
  vq_node *pvVar17;
  uint i_6;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint min_new_capacity;
  ulong uVar22;
  float dist2;
  float fVar23;
  float fVar24;
  float dist2_1;
  float fVar25;
  float fVar26;
  vec<16U,_float> new_right_child;
  vec<16U,_float> new_left_child;
  vec<16U,_float> right_child;
  vec<16U,_float> left_child;
  vec<16U,_float> result;
  float local_178 [16];
  undefined8 local_138;
  float afStack_130 [2];
  uint *local_128;
  undefined8 uStack_120;
  float local_118 [8];
  undefined1 local_f8 [64];
  undefined1 local_b8 [32];
  float local_98 [2];
  float afStack_90 [2];
  float local_88 [2];
  float afStack_80 [4];
  float afStack_70 [16];
  
  pvVar13 = (this->m_nodes).m_p;
  if (pvVar13[index].m_vectors.m_size == 1) {
    return;
  }
  pvVar13 = pvVar13 + index;
  if (this->m_quick == true) {
    compute_split_estimate(this,(vec<16U,_float> *)local_b8,(vec<16U,_float> *)local_f8,pvVar13);
  }
  else {
    compute_split_pca(this,(vec<16U,_float> *)local_b8,(vec<16U,_float> *)local_f8,pvVar13);
  }
  this_00 = &this->m_nodes;
  iVar14 = 8;
  if (this->m_quick != false) {
    iVar14 = 2;
  }
  iVar12 = 0;
  fVar23 = 1e+10;
  do {
    if ((this->m_left_children).m_size != 0) {
      (this->m_left_children).m_size = 0;
    }
    if ((this->m_right_children).m_size != 0) {
      (this->m_right_children).m_size = 0;
    }
    local_118[4] = 0.0;
    local_118[5] = 0.0;
    local_118[6] = 0.0;
    local_118[7] = 0.0;
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[2] = 0.0;
    local_118[3] = 0.0;
    local_128 = (uint *)0x0;
    uStack_120._0_4_ = 0;
    uStack_120._4_4_ = 0;
    local_138 = 0;
    afStack_130[0] = 0.0;
    afStack_130[1] = 0.0;
    local_178[0xc] = 0.0;
    local_178[0xd] = 0.0;
    local_178[0xe] = 0.0;
    local_178[0xf] = 0.0;
    local_178[8] = 0.0;
    local_178[9] = 0.0;
    local_178[10] = 0.0;
    local_178[0xb] = 0.0;
    local_178[4] = 0.0;
    local_178[5] = 0.0;
    local_178[6] = 0.0;
    local_178[7] = 0.0;
    local_178[0] = 0.0;
    local_178[1] = 0.0;
    local_178[2] = 0.0;
    local_178[3] = 0.0;
    if ((pvVar13->m_vectors).m_size == 0) {
LAB_0013fdd1:
      pvVar13->m_unsplittable = true;
      return;
    }
    fVar9 = 0.0;
    uVar21 = 0;
    uVar20 = 0;
    uVar19 = 0;
    fVar10 = 0.0;
    do {
      puVar6 = (pvVar13->m_vectors).m_p;
      uVar11 = puVar6[uVar21];
      ppVar7 = (this->m_training_vecs).m_p;
      ppVar2 = ppVar7 + uVar11;
      uVar22 = (ulong)ppVar7[uVar11].second;
      fVar24 = 0.0;
      lVar16 = 0;
      do {
        fVar25 = *(float *)(local_b8 + lVar16 * 4) - (ppVar2->first).m_s[lVar16];
        fVar24 = fVar24 + fVar25 * fVar25;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x10);
      fVar25 = 0.0;
      lVar16 = 0;
      do {
        fVar26 = *(float *)(local_f8 + lVar16 * 4) - (ppVar2->first).m_s[lVar16];
        fVar25 = fVar25 + fVar26 * fVar26;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x10);
      if (fVar25 <= fVar24) {
        uVar18 = (this->m_right_children).m_size;
        if ((this->m_right_children).m_capacity <= uVar18) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_right_children,uVar18 + 1,true,4,(object_mover)0x0
                     ,false);
          uVar18 = (this->m_right_children).m_size;
          uVar11 = puVar6[uVar21];
        }
        (this->m_right_children).m_p[uVar18] = uVar11;
        puVar1 = &(this->m_right_children).m_size;
        *puVar1 = *puVar1 + 1;
        fVar24 = (float)uVar22;
        lVar16 = 0;
        do {
          pfVar3 = (ppVar2->first).m_s + lVar16;
          fVar25 = pfVar3[1];
          fVar26 = pfVar3[2];
          fVar8 = pfVar3[3];
          afStack_70[lVar16] = *pfVar3 * fVar24;
          afStack_70[lVar16 + 1] = fVar25 * fVar24;
          afStack_70[lVar16 + 2] = fVar26 * fVar24;
          afStack_70[lVar16 + 3] = fVar8 * fVar24;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x10);
        lVar16 = 0;
        do {
          fVar25 = afStack_70[lVar16 + 1];
          fVar26 = afStack_70[lVar16 + 2];
          fVar8 = afStack_70[lVar16 + 3];
          local_178[lVar16] = local_178[lVar16] + afStack_70[lVar16];
          local_178[lVar16 + 1] = local_178[lVar16 + 1] + fVar25;
          local_178[lVar16 + 2] = local_178[lVar16 + 2] + fVar26;
          local_178[lVar16 + 3] = local_178[lVar16 + 3] + fVar8;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x10);
        fVar25 = (ppVar2->first).m_s[0];
        fVar25 = fVar25 * fVar25;
        lVar16 = 1;
        do {
          fVar26 = (ppVar2->first).m_s[lVar16];
          fVar25 = fVar25 + fVar26 * fVar26;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x10);
        uVar19 = uVar19 + uVar22;
        fVar10 = fVar10 + fVar25 * fVar24;
      }
      else {
        uVar18 = (this->m_left_children).m_size;
        if ((this->m_left_children).m_capacity <= uVar18) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_left_children,uVar18 + 1,true,4,(object_mover)0x0,
                     false);
          uVar18 = (this->m_left_children).m_size;
          uVar11 = puVar6[uVar21];
        }
        (this->m_left_children).m_p[uVar18] = uVar11;
        puVar1 = &(this->m_left_children).m_size;
        *puVar1 = *puVar1 + 1;
        fVar24 = (float)uVar22;
        lVar16 = 0;
        do {
          pfVar3 = (ppVar2->first).m_s + lVar16;
          fVar25 = pfVar3[1];
          fVar26 = pfVar3[2];
          fVar8 = pfVar3[3];
          afStack_70[lVar16] = *pfVar3 * fVar24;
          afStack_70[lVar16 + 1] = fVar25 * fVar24;
          afStack_70[lVar16 + 2] = fVar26 * fVar24;
          afStack_70[lVar16 + 3] = fVar8 * fVar24;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x10);
        lVar16 = 0;
        do {
          fVar25 = afStack_70[lVar16 + 1];
          fVar26 = afStack_70[lVar16 + 2];
          fVar8 = afStack_70[lVar16 + 3];
          local_178[lVar16 + 0x10] = local_178[lVar16 + 0x10] + afStack_70[lVar16];
          local_178[lVar16 + 0x11] = local_178[lVar16 + 0x11] + fVar25;
          local_178[lVar16 + 0x12] = local_178[lVar16 + 0x12] + fVar26;
          local_178[lVar16 + 0x13] = local_178[lVar16 + 0x13] + fVar8;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x10);
        fVar25 = (ppVar2->first).m_s[0];
        fVar25 = fVar25 * fVar25;
        lVar16 = 1;
        do {
          fVar26 = (ppVar2->first).m_s[lVar16];
          fVar25 = fVar25 + fVar26 * fVar26;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x10);
        uVar20 = uVar20 + uVar22;
        fVar9 = fVar9 + fVar25 * fVar24;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (pvVar13->m_vectors).m_size);
    if ((uVar20 == 0) || (uVar19 == 0)) goto LAB_0013fdd1;
    fVar24 = (float)local_138 * (float)local_138;
    lVar16 = 1;
    do {
      fVar24 = fVar24 + local_178[lVar16 + 0x10] * local_178[lVar16 + 0x10];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10);
    fVar9 = fVar9 - fVar24 / (float)uVar20;
    fVar24 = local_178[0] * local_178[0];
    lVar16 = 1;
    do {
      fVar24 = fVar24 + local_178[lVar16] * local_178[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10);
    fVar10 = fVar10 - fVar24 / (float)uVar19;
    fVar24 = 1.0 / (float)uVar20;
    lVar16 = 0;
    do {
      local_178[lVar16 + 0x10] = local_178[lVar16 + 0x10] * fVar24;
      local_178[lVar16 + 0x11] = local_178[lVar16 + 0x11] * fVar24;
      local_178[lVar16 + 0x12] = local_178[lVar16 + 0x12] * fVar24;
      local_178[lVar16 + 0x13] = local_178[lVar16 + 0x13] * fVar24;
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x10);
    fVar24 = 1.0 / (float)uVar19;
    lVar16 = 0;
    do {
      local_178[lVar16] = local_178[lVar16] * fVar24;
      local_178[lVar16 + 1] = local_178[lVar16 + 1] * fVar24;
      local_178[lVar16 + 2] = local_178[lVar16 + 2] * fVar24;
      local_178[lVar16 + 3] = local_178[lVar16 + 3] * fVar24;
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x10);
    local_88[0] = local_118[4];
    local_88[1] = local_118[5];
    afStack_80[0] = local_118[6];
    afStack_80[1] = local_118[7];
    local_98[0] = local_118[0];
    local_98[1] = local_118[1];
    afStack_90[0] = local_118[2];
    afStack_90[1] = local_118[3];
    local_b8._16_8_ = local_128;
    local_b8._24_4_ = (uint)uStack_120;
    local_b8._28_4_ = uStack_120._4_4_;
    local_b8._0_8_ = local_138;
    local_b8._8_4_ = afStack_130[0];
    local_b8._12_4_ = afStack_130[1];
    local_f8._0_4_ = local_178[0];
    local_f8._4_4_ = local_178[1];
    local_f8._8_4_ = local_178[2];
    local_f8._12_4_ = local_178[3];
    local_f8._16_4_ = local_178[4];
    local_f8._20_4_ = local_178[5];
    local_f8._24_4_ = local_178[6];
    local_f8._28_4_ = local_178[7];
    local_f8._32_4_ = local_178[8];
    local_f8._36_4_ = local_178[9];
    local_f8._40_4_ = local_178[10];
    local_f8._44_4_ = local_178[0xb];
    local_f8._48_4_ = local_178[0xc];
    local_f8._52_4_ = local_178[0xd];
    local_f8._56_4_ = local_178[0xe];
    local_f8._60_4_ = local_178[0xf];
    fVar24 = fVar9 + fVar10;
  } while (((1e-05 <= fVar24) && (0.00125 <= (fVar23 - fVar24) / fVar24)) &&
          (iVar12 = iVar12 + 1, fVar23 = fVar24, iVar12 != iVar14));
  uVar11 = (this->m_nodes).m_size;
  uVar18 = uVar11 + 1;
  pvVar13->m_left = uVar11;
  pvVar13->m_right = uVar18;
  uVar4 = this->m_split_index;
  min_new_capacity = uVar11 + 2;
  pvVar13->m_codebook_index = uVar4;
  this->m_split_index = uVar4 + 1;
  if (uVar11 >> 1 < 0x7fffffff) {
    if ((this->m_nodes).m_capacity < min_new_capacity) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,min_new_capacity,false,0x70,
                 vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::object_mover,false)
      ;
      uVar5 = (this->m_nodes).m_size;
      uVar15 = min_new_capacity - uVar5;
      if (uVar15 == 0) goto LAB_0013fe6e;
      pvVar13 = (this->m_nodes).m_p + uVar5;
      pvVar17 = pvVar13 + uVar15;
    }
    else {
      pvVar13 = this_00->m_p + uVar11;
      pvVar17 = this_00->m_p + (ulong)uVar11 + 2;
    }
    do {
      (pvVar13->m_vectors).m_p = (uint *)0x0;
      (pvVar13->m_vectors).m_size = 0;
      (pvVar13->m_vectors).m_capacity = 0;
      (pvVar13->m_centroid).m_s[0] = 0.0;
      (pvVar13->m_centroid).m_s[1] = 0.0;
      (pvVar13->m_centroid).m_s[2] = 0.0;
      (pvVar13->m_centroid).m_s[3] = 0.0;
      (pvVar13->m_centroid).m_s[4] = 0.0;
      (pvVar13->m_centroid).m_s[5] = 0.0;
      (pvVar13->m_centroid).m_s[6] = 0.0;
      (pvVar13->m_centroid).m_s[7] = 0.0;
      (pvVar13->m_centroid).m_s[8] = 0.0;
      (pvVar13->m_centroid).m_s[9] = 0.0;
      (pvVar13->m_centroid).m_s[10] = 0.0;
      (pvVar13->m_centroid).m_s[0xb] = 0.0;
      (pvVar13->m_centroid).m_s[0xc] = 0.0;
      (pvVar13->m_centroid).m_s[0xd] = 0.0;
      (pvVar13->m_centroid).m_s[0xe] = 0.0;
      (pvVar13->m_centroid).m_s[0xf] = 0.0;
      pvVar13->m_total_weight = 0;
      pvVar13->m_left = -1;
      pvVar13->m_right = -1;
      pvVar13->m_codebook_index = -1;
      pvVar13->m_unsplittable = false;
      pvVar13 = pvVar13 + 1;
    } while (pvVar13 != pvVar17);
  }
  else {
    pvVar13 = this_00->m_p;
    lVar16 = 0;
    do {
      p = *(void **)((long)(&pvVar13[min_new_capacity].m_centroid + 1) + lVar16 + 0x10);
      if (p != (void *)0x0) {
        crnlib_free(p);
      }
      lVar16 = lVar16 + 0x70;
    } while (lVar16 != 0x6fffffff20);
  }
LAB_0013fe6e:
  (this->m_nodes).m_size = min_new_capacity;
  pvVar13 = (this->m_nodes).m_p;
  pvVar17 = pvVar13 + uVar11;
  if (pvVar17 != (vq_node *)local_b8) {
    lVar16 = 0;
    do {
      (pvVar17->m_centroid).m_s[lVar16] = *(float *)(local_b8 + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10);
  }
  pvVar13 = pvVar13 + uVar18;
  pvVar17->m_total_weight = uVar20;
  puVar6 = (pvVar17->m_vectors).m_p;
  (pvVar17->m_vectors).m_p = (this->m_left_children).m_p;
  (this->m_left_children).m_p = puVar6;
  uVar4 = (pvVar17->m_vectors).m_size;
  (pvVar17->m_vectors).m_size = (this->m_left_children).m_size;
  (this->m_left_children).m_size = uVar4;
  uVar4 = (pvVar17->m_vectors).m_capacity;
  (pvVar17->m_vectors).m_capacity = (this->m_left_children).m_capacity;
  (this->m_left_children).m_capacity = uVar4;
  pvVar17->m_variance = fVar9;
  if ((1 < (pvVar17->m_vectors).m_size) && (0.0 < fVar9)) {
    insert_heap(this,uVar11);
  }
  if (pvVar13 != (vq_node *)local_f8) {
    lVar16 = 0;
    do {
      (pvVar13->m_centroid).m_s[lVar16] = *(float *)(local_f8 + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10);
  }
  pvVar13->m_total_weight = uVar19;
  puVar6 = (pvVar13->m_vectors).m_p;
  (pvVar13->m_vectors).m_p = (this->m_right_children).m_p;
  (this->m_right_children).m_p = puVar6;
  uVar4 = (pvVar13->m_vectors).m_size;
  (pvVar13->m_vectors).m_size = (this->m_right_children).m_size;
  (this->m_right_children).m_size = uVar4;
  uVar4 = (pvVar13->m_vectors).m_capacity;
  (pvVar13->m_vectors).m_capacity = (this->m_right_children).m_capacity;
  (this->m_right_children).m_capacity = uVar4;
  pvVar13->m_variance = fVar10;
  if ((1 < (pvVar13->m_vectors).m_size) && (0.0 < fVar10)) {
    insert_heap(this,uVar18);
  }
  return;
}

Assistant:

training_vec_array& get_training_vecs()
        {
            return m_training_vecs;
        }